

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

void free_rule(Rule *r)

{
  char *pcVar1;
  Elem **__ptr;
  Code **__ptr_00;
  ulong uVar2;
  
  free(r->end);
  pcVar1 = (r->final_code).code;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (r->speculative_code).code;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  __ptr = (r->elems).v;
  if (__ptr != (r->elems).e && __ptr != (Elem **)0x0) {
    free(__ptr);
  }
  (r->elems).n = 0;
  (r->elems).v = (Elem **)0x0;
  if ((r->pass_code).n != 0) {
    uVar2 = 0;
    do {
      free((r->pass_code).v[uVar2]->code);
      free((r->pass_code).v[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (r->pass_code).n);
  }
  __ptr_00 = (r->pass_code).v;
  if (__ptr_00 != (r->pass_code).e && __ptr_00 != (Code **)0x0) {
    free(__ptr_00);
  }
  (r->pass_code).n = 0;
  (r->pass_code).v = (Code **)0x0;
  free(r);
  return;
}

Assistant:

static void free_rule(Rule *r) {
  uint i;
  FREE(r->end);
  if (r->final_code.code) FREE(r->final_code.code);
  if (r->speculative_code.code) FREE(r->speculative_code.code);
  vec_free(&r->elems);
  for (i = 0; i < r->pass_code.n; i++) {
    FREE(r->pass_code.v[i]->code);
    FREE(r->pass_code.v[i]);
  }
  vec_free(&r->pass_code);
  FREE(r);
}